

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver-c.cc
# Opt level: O0

void __thiscall
mp::NLW2_NLFeeder_C_Impl::
FeedInitialDualGuesses<mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,mp::NLW2_NLFeeder_C_Impl>>::SingleSparseVecWrtFactory<int,double>>
          (NLW2_NLFeeder_C_Impl *this,SingleSparseVecWrtFactory<int,_double> *igw)

{
  NLW2_NLFeeder_C *pNVar1;
  function<void_(int,_double)> *in_RDI;
  function<void_(int,_double)> wrt;
  SparseVectorWriter<int,_double> ig;
  int nnz;
  anon_class_8_1_3fcf65dc *in_stack_ffffffffffffff88;
  _func_void_void_ptr_void_ptr *p_Var2;
  SingleSparseVecWrtFactory<int,_double> *this_00;
  undefined1 local_48 [32];
  SparseVectorWriter<int,_double> local_28;
  int local_14;
  
  pNVar1 = NLF((NLW2_NLFeeder_C_Impl *)in_RDI);
  this_00 = (SingleSparseVecWrtFactory<int,_double> *)pNVar1->InitialDualGuessesNNZ;
  pNVar1 = NLF((NLW2_NLFeeder_C_Impl *)in_RDI);
  local_14 = (*(code *)this_00)(pNVar1->p_user_data_);
  if (local_14 != 0) {
    NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLW2_NLFeeder_C_Impl>_>::
    SingleSparseVecWrtFactory<int,_double>::MakeVectorWriter(this_00,(size_t)in_RDI);
    std::function<void(int,double)>::
    function<mp::NLW2_NLFeeder_C_Impl::FeedInitialDualGuesses<mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,mp::NLW2_NLFeeder_C_Impl>>::SingleSparseVecWrtFactory<int,double>>(mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,mp::NLW2_NLFeeder_C_Impl>>::SingleSparseVecWrtFactory<int,double>&)::_lambda(int,double)_1_,void>
              (in_RDI,in_stack_ffffffffffffff88);
    pNVar1 = NLF((NLW2_NLFeeder_C_Impl *)in_RDI);
    p_Var2 = pNVar1->FeedInitialDualGuesses;
    pNVar1 = NLF((NLW2_NLFeeder_C_Impl *)in_RDI);
    (*p_Var2)(pNVar1->p_user_data_,local_48);
    std::function<void_(int,_double)>::~function((function<void_(int,_double)> *)0x1158eb);
    NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLW2_NLFeeder_C_Impl>_>::
    SparseVectorWriter<int,_double>::~SparseVectorWriter(&local_28);
  }
  return;
}

Assistant:

void mp::NLW2_NLFeeder_C_Impl::FeedInitialDualGuesses(IGWriter& igw) {
  assert(NLF().InitialDualGuessesNNZ);
  if (int nnz = NLF().InitialDualGuessesNNZ(NLF().p_user_data_)) {
    assert(NLF().FeedInitialDualGuesses);
    auto ig = igw.MakeVectorWriter(nnz);
    std::function<void(int, double)> wrt
        = [&ig](int i, double v){
      ig.Write(i, v);
    };
    NLF().FeedInitialDualGuesses(NLF().p_user_data_, &wrt);
  }
}